

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

float Gia_ManPatGetTotalQuo(Gia_Man_t *p,int RareLimit,Vec_Wrd_t *vPatterns,int nWords)

{
  Vec_Wrd_t *pVVar1;
  Vec_Int_t *p_00;
  Vec_Wrd_t *p_01;
  int n;
  int iVar2;
  float fVar3;
  float local_34;
  
  p_00 = Gia_SimCollectRare(p,vPatterns,RareLimit);
  pVVar1 = p->vSimsPi;
  p->vSimsPi = vPatterns;
  p_01 = Gia_ManSimPatSim(p);
  p->vSimsPi = pVVar1;
  iVar2 = nWords << 6;
  n = 0;
  if (nWords << 6 < 1) {
    iVar2 = 0;
  }
  local_34 = 0.0;
  for (; iVar2 != n; n = n + 1) {
    fVar3 = Gia_ManPatGetQuo(p,p_00,p_01,n,nWords);
    local_34 = local_34 + fVar3;
  }
  Vec_IntFree(p_00);
  Vec_WrdFree(p_01);
  return local_34;
}

Assistant:

float Gia_ManPatGetTotalQuo( Gia_Man_t * p, int RareLimit, Vec_Wrd_t * vPatterns, int nWords )
{
    float Total = 0; int n;
    Vec_Int_t * vRareCounts = Gia_SimCollectRare( p, vPatterns, RareLimit );
    Vec_Wrd_t * vSims, * vTemp = p->vSimsPi;
    p->vSimsPi = vPatterns;
    vSims = Gia_ManSimPatSim( p );
    p->vSimsPi = vTemp;
    for ( n = 0; n < 64*nWords; n++ )
        Total += Gia_ManPatGetQuo( p, vRareCounts, vSims, n, nWords );
    Vec_IntFree( vRareCounts );
    Vec_WrdFree( vSims );
    return Total;
}